

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmTargetExport *pcVar1;
  cmExportSet *pcVar2;
  pointer puVar3;
  cmGeneratorTarget *this_00;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  int iVar9;
  long *plVar10;
  ostream *poVar11;
  string *psVar12;
  cmValue cVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  undefined8 uVar19;
  pointer puVar20;
  string *c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pbVar22;
  bool bVar23;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar24;
  string expectedTargets;
  string sep;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  string local_280;
  undefined8 local_260;
  uint local_254;
  uint local_250;
  uint local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  cmTargetExport *local_228;
  ostream *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  long *local_1d8;
  long *plStack_1d0;
  long local_1c8;
  long *local_1b8;
  long *local_1b0;
  undefined1 local_1a8 [24];
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_1d8 = (long *)0x0;
  plStack_1d0 = (long *)0x0;
  local_1c8 = 0;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  pcVar2 = this->IEGen->ExportSet;
  puVar20 = (pcVar2->TargetExports).
            super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = os;
  if (puVar20 != puVar3) {
    local_228 = (cmTargetExport *)&(this->super_cmExportFileGenerator).Namespace;
    local_260 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    do {
      iVar9 = 3;
      if (((puVar20->_M_t).
           super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
           super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->NamelinkOnly == false) {
        std::operator+(&local_218,&local_248,&local_228->TargetName);
        cmGeneratorTarget::GetExportName_abi_cxx11_
                  (&local_1f8,
                   ((puVar20->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          uVar19 = local_218.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length) {
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            uVar19 = local_1f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length)
          goto LAB_00567bde;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_1f8,0,(char *)0x0,
                                       (ulong)local_218._M_dataplus._M_p);
        }
        else {
LAB_00567bde:
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        pcVar1 = (cmTargetExport *)(plVar10 + 2);
        if ((cmTargetExport *)*plVar10 == pcVar1) {
          local_1a8._16_8_ = (pcVar1->TargetName)._M_dataplus._M_p;
          p_Stack_190 = (_Base_ptr)plVar10[3];
        }
        else {
          local_1a8._16_8_ = (pcVar1->TargetName)._M_dataplus._M_p;
          local_1a8._0_8_ = (cmTargetExport *)*plVar10;
        }
        local_1a8._8_8_ = plVar10[1];
        *plVar10 = (long)pcVar1;
        plVar10[1] = 0;
        *(undefined1 *)&(pcVar1->TargetName)._M_dataplus._M_p = 0;
        std::__cxx11::string::_M_append((char *)&local_280,local_1a8._0_8_);
        if ((cmTargetExport *)local_1a8._0_8_ != (cmTargetExport *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_1a8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_248,0,(char *)local_248._M_string_length,0x7903d6);
        pVar24 = std::
                 _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 ::_M_insert_unique<cmGeneratorTarget*const&>
                           (local_260,
                            &((puVar20->_M_t).
                              super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                              .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target)
        ;
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"install(EXPORT \"",0x10);
          pcVar2 = this->IEGen->ExportSet;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                               (pcVar2->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ...) ",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"includes target \"",0x11);
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                              (((puVar20->_M_t).
                                super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                               Target);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" more than once in the export set.",0x23);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar9 = 1;
        }
        else {
          local_1a8._0_8_ =
               (puVar20->_M_t).
               super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
               super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
               super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
          std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
          emplace_back<cmTargetExport*>
                    ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1d8,
                     (cmTargetExport **)local_1a8);
          iVar9 = 0;
        }
      }
      if ((iVar9 != 3) && (iVar9 != 0)) goto LAB_00567e41;
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar3);
  }
  iVar9 = 2;
LAB_00567e41:
  poVar11 = local_220;
  if (iVar9 == 2) {
    iVar9 = 0;
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
              (this,local_220,&local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x17])(this);
    local_1b8 = plStack_1d0;
    bVar23 = local_1d8 == plStack_1d0;
    if (bVar23) {
      local_260 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                   *)((ulong)local_260._4_4_ << 0x20);
      uVar18 = 0;
      uVar16 = 0;
      uVar14 = 0;
    }
    else {
      local_254 = 0;
      local_24c = 0;
      local_250 = 0;
      local_260 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                   *)((ulong)local_260._4_4_ << 0x20);
      plVar10 = local_1d8;
      do {
        paVar21 = &local_280.field_2;
        local_228 = (cmTargetExport *)*plVar10;
        this_00 = local_228->Target;
        local_1b0 = plVar10;
        TVar7 = cmGeneratorTarget::GetType(this_00);
        if (TVar7 == OBJECT_LIBRARY) {
          TVar7 = (uint)(local_228->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                  OBJECT_LIBRARY;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,poVar11,this_00);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = (_Base_ptr)0x0;
        p_Stack_190 = (_Base_ptr)(local_1a8 + 8);
        local_180 = 0;
        local_188 = p_Stack_190;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,local_228);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_PRECOMPILE_HEADERS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar21) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateLinkDirectoriesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        cmExportFileGenerator::PopulateLinkDependsInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        local_280._M_dataplus._M_p = (pointer)paVar21;
        bVar5 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8
                           ,&local_280);
        if (bVar5) {
          PVar8 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if ((((PVar8 != WARN) &&
               (PVar8 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022), PVar8 != OLD)) &&
              (bVar6 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                 (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                                  (ImportPropertyMap *)local_1a8), bVar6)) &&
             (local_254 = local_254 & 0xff, (this->super_cmExportFileGenerator).ExportOld == false))
          {
            local_254 = 1;
          }
          local_24c = local_24c & 0xff;
          if (TVar7 == INTERFACE_LIBRARY) {
            local_24c = 1;
          }
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"INTERFACE_SOURCES","");
          cVar13 = cmGeneratorTarget::GetProperty(this_00,&local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
          local_250 = local_250 & 0xff;
          if (cVar13.Value != (string *)0x0) {
            local_250 = 1;
          }
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"INTERFACE_POSITION_INDEPENDENT_CODE","");
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_248,this_00,
                     (ImportPropertyMap *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_220,local_1a8);
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,this_00,local_220,local_228);
        }
        else {
          cmSystemTools::Error(&local_280);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_260 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                     *)CONCAT44(local_260._4_4_,
                                CONCAT31((int3)((ulong)local_260 >> 8),
                                         (byte)local_260 | TVar7 != INTERFACE_LIBRARY));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        poVar11 = local_220;
        uVar18 = local_250;
        uVar16 = local_24c;
        uVar14 = local_254;
        if (!bVar5) break;
        plVar10 = local_1b0 + 1;
        bVar23 = plVar10 == local_1b8;
      } while (!bVar23);
    }
    if (bVar23) {
      if ((((byte)uVar18 | (byte)uVar16 | (byte)uVar14) & 1) != 0) {
        pcVar15 = "2.8.12";
        if ((uVar16 & 1) != 0) {
          pcVar15 = "3.0.0";
        }
        pcVar17 = "3.1.0";
        if ((uVar18 & 1) == 0) {
          pcVar17 = pcVar15;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                  (this,poVar11,pcVar17);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,poVar11);
      cmExportFileGenerator::GenerateCxxModuleInformation
                (&this->super_cmExportFileGenerator,poVar11);
      bVar23 = true;
      if (((ulong)local_260 & 1) != 0) {
        pbVar22 = (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (this->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar22 != pbVar4) {
          bVar23 = true;
          do {
            bVar5 = GenerateImportCxxModuleConfigTargetInclusion(this,pbVar22);
            if (!bVar5) {
              bVar23 = false;
            }
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 != pbVar4);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,poVar11);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,poVar11);
      if (((ulong)local_260 & 1) != 0) {
        pbVar22 = (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (this->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar22 != pbVar4) {
          do {
            iVar9 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])
                              (this,pbVar22);
            if ((char)iVar9 == '\0') {
              bVar23 = false;
            }
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 != pbVar4);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,poVar11);
      goto LAB_005684f5;
    }
  }
  bVar23 = false;
LAB_005684f5:
  if (local_1d8 != (long *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  return bVar23;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  bool result = true;

  this->GenerateCxxModuleInformation(os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}